

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepTiledOutputFile::breakTile
          (DeepTiledOutputFile *this,int dx,int dy,int lx,int ly,int offset,int length,char c)

{
  long *plVar1;
  uint64_t *puVar2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int i;
  stringstream _iex_throw_s;
  uint64_t position;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffdb8;
  lock_guard<std::mutex> *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  TileOffsets *in_stack_fffffffffffffde8;
  int local_1cc;
  stringstream local_1c8 [16];
  ostream local_1b8 [392];
  uint64_t local_30;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  puVar2 = TileOffsets::operator()
                     (in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                      (int)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20)
                      ,(int)in_stack_fffffffffffffdd8);
  local_30 = *puVar2;
  if (local_30 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar3 = std::operator<<(local_1b8,"Cannot overwrite tile (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,"). The tile has not yet been stored in file \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x1be5dc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this_00,local_1c8);
    __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1c0) + 0x30) = 0;
  plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1c0) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_30 + (long)local_1c);
  for (local_1cc = 0; local_1cc < in_stack_00000008; local_1cc = local_1cc + 1) {
    plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1c0) + 0x28);
    (**(code **)(*plVar1 + 0x10))(plVar1,&stack0x00000010,1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1be74e);
  return;
}

Assistant:

void
DeepTiledOutputFile::breakTile (
    int dx, int dy, int lx, int ly, int offset, int length, char c)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    uint64_t position = _data->tileOffsets (dx, dy, lx, ly);

    if (!position)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot overwrite tile "
            "(" << dx
                << ", " << dy << ", " << lx << "," << ly
                << "). "
                   "The tile has not yet been stored in "
                   "file \""
                << fileName () << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}